

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

void throwit(obj *obj,obj *ostack,long wep_mask,boolean twoweap,schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  monst *pmVar2;
  char cVar3;
  boolean bVar4;
  schar sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  obj *poVar9;
  monst *mon;
  char *oldstr;
  undefined7 in_register_00000009;
  long lVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  char cVar15;
  char *pcVar16;
  bool bVar17;
  bool bVar18;
  undefined4 local_58;
  undefined2 uStack_54;
  char local_52;
  boolean obj_destroyed;
  undefined4 local_50;
  int dmg;
  ulong local_48;
  obj *local_40;
  d_level *local_38;
  
  uVar8 = (uint)CONCAT71(in_register_00000089,dy);
  local_50 = (undefined4)CONCAT71(in_register_00000009,twoweap);
  bVar17 = true;
  local_48 = wep_mask;
  local_40 = ostack;
  if ((((u.umonnum != 0x9e && (u.uprops[0x1b].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0)) &&
       ((youmonst.data)->mlet != '\x1c')) &&
      (((u.uprops[0x1e].intrinsic == 0 &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) &&
     ((u.uprops[0x23].intrinsic == 0 ||
      ((u.uprops[0x24].extrinsic != 0 ||
       ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))))) {
    bVar17 = u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0;
  }
  uVar6 = *(uint *)&obj->field_0x4a;
  *(uint *)&obj->field_0x4a = uVar6 | 0x2000000;
  if ((((((uVar6 & 1) != 0) && (uVar6 = mt_random(), uVar6 * -0x49249249 < 0x24924925)) ||
       (((obj->field_0x4c & 0x10) != 0 && (uVar6 = mt_random(), uVar6 * -0x49249249 < 0x24924925))))
      || ((iVar7 = weapon_type(obj), u.weapon_skills[iVar7].skill == '\0' &&
          (uVar6 = mt_random(), uVar6 * -0x33333333 < 0x33333334)))) &&
     (u.dy != '\0' || u.dx != '\0')) {
    if ((obj->oclass == '\r') || (obj->oclass == '\x02')) {
      cVar15 = objects[obj->otyp].oc_subtyp;
      if ((cVar15 < -0x18) ||
         ((uwep == (obj *)0x0 || -0x16 < cVar15 ||
          ((int)cVar15 + (int)objects[uwep->otyp].oc_subtyp != 0)))) goto LAB_00180395;
      pcVar16 = "%s!";
      pcVar12 = "misfire";
    }
    else {
LAB_00180395:
      local_58 = (undefined4)CONCAT71(in_register_00000081,dx);
      pcVar16 = "%s as you throw it!";
      pcVar12 = "slip";
      if (((obj->field_0x4c & 0x10) == 0) && (bVar4 = throwing_weapon(obj), bVar4 == '\0'))
      goto LAB_00180446;
    }
    pcVar12 = Tobjnam(obj,pcVar12);
    pline(pcVar16,pcVar12);
    uVar8 = mt_random();
    dx = (char)uVar8 + (char)(uVar8 / 3) * -3 + -1;
    uVar8 = mt_random();
    bVar14 = (char)(uVar8 % 3) - 1;
    uVar8 = (uint)bVar14;
    bVar17 = true;
    if (dx == '\0' && bVar14 == 0) {
      uVar6 = mt_random();
      dz = -(uVar6 * -0x55555555 < 0x55555556) | 1;
    }
  }
LAB_00180446:
  if ((((dx != '\0') || ((char)uVar8 != '\0')) || (dz < '\x01')) &&
     (iVar7 = calc_capacity(obj->owt), 1 < iVar7)) {
    if (u.umonnum == u.umonster) {
      if ((u.uhp < 10) && (u.uhp != u.uhpmax)) {
LAB_001804b5:
        lVar10 = 0x3f8;
        if (u.umonnum == u.umonster) {
          lVar10 = 0x4c0;
        }
        if (((uint)(*(int *)(u.urooms + lVar10 + -0x24) * 2) < obj->owt) &&
           (bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar4 == '\0')) {
          pcVar12 = xname(obj);
          the(pcVar12);
          dx = '\0';
          pline("You have so little stamina, %s drops from your grasp.");
          exercise(4,'\0');
          dz = 1;
          uVar8 = 0;
        }
      }
    }
    else if ((u.mh < 5) && (u.mh != u.mhmax)) goto LAB_001804b5;
  }
  cVar15 = (char)uVar8;
  thrownobj = obj;
  if ((u._1052_1_ & 1) == 0) {
    if (dz != 0) {
      if ((((-1 < dz) || (urole.malenum != 0x167)) || (obj->oartifact != '\x05')) ||
         (bVar17 != false)) {
        if (((dz < '\0') && (bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar4 == '\0'))
           && (((u._1052_1_ & 2) == 0 &&
               (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 == '\0')))) {
          uVar8 = mt_random();
          toss_up(obj,local_40,(boolean)(uVar8 % 5));
          thrownobj = (obj *)0x0;
          return;
        }
        hitfloor(obj,local_40,'\x01');
        thrownobj = (obj *)0x0;
        return;
      }
      pcVar12 = Tobjnam(obj,"hit");
      pcVar16 = ceiling((int)u.ux,(int)u.uy);
      pline("%s the %s and returns to your hand!",pcVar12,pcVar16);
      poVar9 = addinv((obj *)CONCAT17(obj_destroyed,CONCAT16(local_52,CONCAT24(uStack_54,local_58)))
                     );
      encumber_msg();
      setuwep(poVar9);
LAB_001805c2:
      u.twoweap = (boolean)local_50;
      thrownobj = (obj *)0x0;
      return;
    }
    if (((u._1052_1_ & 2) == 0) && (obj->otyp == 9)) {
      bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar4 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        hurtle(-(int)dx,-(int)cVar15,1,'\x01');
      }
      mon = boomhit((int)dx,(int)cVar15);
      if (mon == &youmonst) {
        exercise(3,'\x01');
        poVar9 = addinv((obj *)CONCAT17(obj_destroyed,
                                        CONCAT16(local_52,CONCAT24(uStack_54,local_58))));
        encumber_msg();
        if (local_48 == 0) {
          thrownobj = (obj *)0x0;
          return;
        }
        if (((long)poVar9->owornmask & local_48) != 0) {
          thrownobj = (obj *)0x0;
          return;
        }
        setworn(poVar9,local_48);
        goto LAB_001805c2;
      }
    }
    else {
      sVar5 = acurrstr();
      uVar6 = 0x28;
      if ((long)obj->otyp == 0x216) {
        uVar6 = 100;
      }
      local_48 = CONCAT44(local_48._4_4_,(int)(sVar5 / '\x02'));
      uVar11 = (int)(sVar5 / '\x02') - obj->owt / uVar6;
      uVar6 = uVar11;
      if (((uball == obj) && (uVar6 = 1, u.ustuck == (monst *)0x0)) && (uVar6 = 5, (int)uVar11 < 5))
      {
        uVar6 = uVar11;
      }
      uVar11 = 1;
      if (1 < (int)uVar6) {
        uVar11 = uVar6;
      }
      cVar3 = obj->oclass;
      if (((cVar3 == '\r') || (cVar3 == '\x02')) &&
         ((byte)(objects[obj->otyp].oc_subtyp + 0x18U) < 3)) {
        if (((cVar3 == '\r') || (cVar3 == '\x02')) &&
           ((uwep != (obj *)0x0 &&
            ((int)objects[obj->otyp].oc_subtyp + (int)objects[uwep->otyp].oc_subtyp == 0)))) {
          uVar11 = uVar11 + 1;
        }
        else {
          uVar11 = uVar11 >> (cVar3 != '\r');
        }
      }
      local_38 = &u.uz;
      bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if ((((bVar4 != '\0') || (u.uprops[0x12].intrinsic != 0)) || (u.uprops[0x12].extrinsic != 0))
         || ((youmonst.data)->mlet == '\x05')) {
        iVar7 = (int)local_48 - uVar11;
        if (iVar7 < 2) {
          iVar7 = 1;
        }
        local_48 = CONCAT44(local_48._4_4_,iVar7);
        uVar11 = uVar11 - iVar7;
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
      }
      uVar6 = 0x14;
      if (obj->otyp != 0x214) {
        if (obj->oartifact == '\x05') {
          uVar6 = uVar11 + 1 >> 1;
        }
        else {
          uVar6 = 1;
          if (u.utraptype != 4) {
            uVar6 = uVar11;
          }
          if (u.utrap == 0) {
            uVar6 = uVar11;
          }
          if (uball != obj) {
            uVar6 = uVar11;
          }
        }
      }
      if ((u._1052_1_ & 2) != 0) {
        uVar6 = 1;
      }
      obj_destroyed = '\0';
      mon = beam_hit((int)dx,(int)cVar15,uVar6,1,(_func_int_monst_ptr_obj_ptr *)0x0,
                     (_func_int_obj_ptr_obj_ptr *)0x0,obj,&obj_destroyed);
      bVar4 = on_level(local_38,&dungeon_topology.d_air_level);
      if (((bVar4 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        hurtle(-(int)dx,-(int)cVar15,(int)local_48,'\x01');
      }
      local_52 = bVar17;
      if (obj_destroyed != '\0') {
        return;
      }
    }
  }
  else {
    bhitpos.x = (u.ustuck)->mx;
    bhitpos.y = (u.ustuck)->my;
    mon = u.ustuck;
  }
  if (mon == (monst *)0x0) {
    mon = (monst *)0x0;
  }
  else {
    if ((((mon->field_0x63 & 2) == 0) || (obj->where != '\x04')) ||
       ((monst *)(obj->v).v_nexthere != mon)) {
      snuff_candle(obj);
      notonhead = true;
      if (bhitpos.x == mon->mx) {
        notonhead = bhitpos.y != mon->my;
      }
      iVar7 = thitmonst(mon,obj,local_40);
      pmVar2 = level->monsters[bhitpos.x][bhitpos.y];
      mon = (monst *)0x0;
      if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
        mon = pmVar2;
      }
      if ((mon != (monst *)0x0) && ((mon->field_0x63 & 2) != 0)) {
        cVar3 = inside_shop(level,u.ux,u.uy);
        if (cVar3 != '\0') {
          pcVar12 = in_rooms(level,mon->mx,mon->my,0x12);
          pcVar12 = strchr(pcVar12,(int)u.ushops[0]);
          if (pcVar12 != (char *)0x0) goto LAB_001806ec;
        }
        hot_pursuit(mon);
      }
LAB_001806ec:
      bVar18 = iVar7 == 0;
    }
    else {
      thrownobj = (obj *)0x0;
      bVar18 = false;
    }
    if (!bVar18) {
      return;
    }
  }
  if ((u._1052_1_ & 1) != 0) {
    if (uball != obj) {
      mpickobj(u.ustuck,obj);
      return;
    }
    return;
  }
  if (((obj->oartifact == '\x05') && (urole.malenum == 0x167)) &&
     (uVar6 = mt_random(), 0x28f5c28 < (uVar6 * -0x3d70a3d7 >> 2 | uVar6 * 0x40000000))) {
    sho_obj_return_to_u(obj,dx,cVar15);
    if ((bVar17 == false) &&
       (uVar6 = mt_random(), 0x28f5c28 < (uVar6 * -0x3d70a3d7 >> 2 | uVar6 * 0x40000000))) {
      pcVar12 = Tobjnam(obj,"return");
      pline("%s to your hand!",pcVar12);
      poVar9 = addinv((obj *)CONCAT17(obj_destroyed,CONCAT16(local_52,CONCAT24(uStack_54,uVar8))));
      encumber_msg();
      setuwep(poVar9);
      u.twoweap = (boolean)local_50;
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
        newsym((int)bhitpos.x,(int)bhitpos.y);
      }
    }
    else {
      uVar8 = mt_random();
      dmg = uVar8 & 1;
      if ((uVar8 & 1) == 0) {
        if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) {
          pcVar12 = "%s back to you, landing %s your %s.";
        }
        else if (ublindf == (obj *)0x0) {
          pcVar12 = "%s lands %s your %s.";
        }
        else {
          pcVar12 = "%s lands %s your %s.";
          if (ublindf->oartifact == '\x1d') {
            pcVar12 = "%s back to you, landing %s your %s.";
          }
        }
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((pcVar16 = "Something", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar16 = Tobjnam(obj,"return");
        }
        if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
          pcVar13 = "at";
          if ((youmonst.data)->mlet == '\x05') {
            pcVar13 = "beneath";
          }
        }
        else {
          pcVar13 = "beneath";
        }
        oldstr = body_part(5);
        makeplural(oldstr);
        pline(pcVar12,pcVar16,pcVar13);
      }
      else {
        uVar8 = mt_random();
        dmg = uVar8 % 3 + dmg + 1;
        if ((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
          pcVar12 = "%s back toward you, hitting your %s!";
        }
        else if (ublindf == (obj *)0x0) {
          pcVar12 = "%s your %s!";
        }
        else {
          pcVar12 = "%s your %s!";
          if (ublindf->oartifact == '\x1d') {
            pcVar12 = "%s back toward you, hitting your %s!";
          }
        }
        if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) {
          pcVar16 = "fly";
        }
        else if (ublindf == (obj *)0x0) {
          pcVar16 = "hit";
        }
        else {
          pcVar16 = "hit";
          if (ublindf->oartifact == '\x1d') {
            pcVar16 = "fly";
          }
        }
        pcVar16 = Tobjnam(obj,pcVar16);
        pcVar13 = body_part(0);
        pline(pcVar12,pcVar16,pcVar13);
        artifact_hit((monst *)0x0,&youmonst,obj,local_40,'\x01',&dmg,0);
        iVar7 = dmg;
        pcVar12 = xname(obj);
        bVar4 = obj_is_pname(obj);
        losehp(iVar7,pcVar12,(uint)(bVar4 != '\0'));
      }
      bVar4 = ship_object(obj,u.ux,u.uy,'\0');
      if (bVar4 != '\0') {
        thrownobj = (obj *)0x0;
        return;
      }
      dropy(obj);
    }
  }
  else {
    bVar14 = level->locations[bhitpos.x][bhitpos.y].typ;
    if (((1 < (byte)(bVar14 - 0x25)) && (3 < bVar14 - 0x11)) &&
       ((bVar14 != 0x23 && (bVar4 = breaktest(obj), bVar4 != '\0')))) {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
        iVar7 = (int)obj->otyp;
      }
      else {
        iVar7 = display_rng(0x219);
        iVar7 = iVar7 + 1;
      }
      tmp_at(-4,iVar7 + 1);
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      tmp_at(-6,0);
      breakmsg(obj,viz_array[bhitpos.y][bhitpos.x] & 2);
      breakobj(obj,bhitpos.x,bhitpos.y,'\x01','\x01');
      return;
    }
    bVar4 = flooreffects(obj,(int)bhitpos.x,(int)bhitpos.y,"fall");
    if (bVar4 != '\0') {
      return;
    }
    obj_no_longer_held(obj);
    bVar4 = detonate_obj(obj,local_40,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
    if (bVar4 != '\0') {
      return;
    }
    if (mon == (monst *)0x0) {
      snuff_candle(obj);
      bVar4 = ship_object(obj,bhitpos.x,bhitpos.y,'\0');
      if (bVar4 == '\0') goto LAB_001810f6;
    }
    else {
      if ((((mon->field_0x63 & 2) == 0) || ((byte)(obj->oclass | 4U) != 6)) ||
         (objects[obj->otyp].oc_subtyp != '\x04')) {
        snuff_candle(obj);
LAB_001810f6:
        thrownobj = (obj *)0x0;
        place_object(obj,level,(int)bhitpos.x,(int)bhitpos.y);
        if ((u.ushops[0] != '\0') && (uball != obj)) {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
        }
        stackobj((obj *)CONCAT17(obj_destroyed,CONCAT16(local_52,CONCAT24(uStack_54,uVar8))));
        if (uball == obj) {
          drop_ball(bhitpos.x,bhitpos.y,dx,cVar15);
        }
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
          newsym((int)bhitpos.x,(int)bhitpos.y);
        }
        bVar4 = obj_sheds_light(obj);
        if (bVar4 != '\0') {
          vision_full_recalc = '\x01';
        }
        puVar1 = &level->locations[bhitpos.x][bhitpos.y].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
        bVar14 = level->locations[bhitpos.x][bhitpos.y].typ;
        if ((byte)(bVar14 - 0x25) < 2) {
          return;
        }
        if (bVar14 - 0x11 < 4) {
          return;
        }
        if (bVar14 != 0x23) {
          container_impact_dmg(obj);
          return;
        }
        return;
      }
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
        pcVar12 = Monnam(mon);
        pcVar16 = xname(obj);
        pcVar16 = the(pcVar16);
        pline("%s snatches up %s.",pcVar12,pcVar16);
      }
      if (u.ushops[0] != '\0') {
        check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
      }
      mpickobj(mon,obj);
    }
  }
  thrownobj = (obj *)0x0;
  return;
}

Assistant:

void throwit(struct obj *obj,
	     struct obj *ostack,
	     long wep_mask,  /* used to re-equip returning boomerang */
	     boolean twoweap, /* used to restore twoweapon mode if wielded weapon returns */
	     schar dx, schar dy, schar dz)
{
	struct monst *mon;
	int range, urange;
	boolean impaired = (Confusion || Stunned || Blind ||
			   Hallucination || Fumbling);

	obj->was_thrown = 1;
	/* Split slip chance of cursed and greased objects; one that is both
	 * has a 1-(6/7)^2 (or 13/49, or ~26%) chance of slipping.
	 * Also, restricted throwing has a 20% chance of slipping
	 * to discourage role-/race-atypical fighting.
	 */
	if (((obj->cursed && rnf(1,7)) ||
	     (obj->greased && rnf(1,7)) ||
	     (P_SKILL(weapon_type(obj)) == P_ISRESTRICTED && rnf(1,5))) &&
	    (u.dx || u.dy)) {
	    boolean slipok = TRUE;
	    if (ammo_and_launcher(obj, uwep))
		pline("%s!", Tobjnam(obj, "misfire"));
	    else {
		/* only slip if it's greased or meant to be thrown */
		if (obj->greased || throwing_weapon(obj))
		    /* BUG: this message is grammatically incorrect if obj has
		       a plural name; greased gloves or boots for instance. */
		    pline("%s as you throw it!", Tobjnam(obj, "slip"));
		else slipok = FALSE;
	    }
	    if (slipok) {
		dx = rn2(3)-1;
		dy = rn2(3)-1;
		if (!dx && !dy)
		    dz = rnf(1,3) ? -1 : 1;
		impaired = TRUE;
	    }
	}

	if ((dx || dy || (dz < 1)) &&
	    calc_capacity((int)obj->owt) > SLT_ENCUMBER &&
	    (Upolyd ? (u.mh < 5 && u.mh != u.mhmax)
	     : (u.uhp < 10 && u.uhp != u.uhpmax)) &&
	    obj->owt > (unsigned)((Upolyd ? u.mh : u.uhp) * 2) &&
	    !Is_airlevel(&u.uz)) {
	    pline("You have so little stamina, %s drops from your grasp.",
		the(xname(obj)));
	    exercise(A_CON, FALSE);
	    dx = dy = 0;
	    dz = 1;
	}

	thrownobj = obj;

	if (u.uswallow) {
		mon = u.ustuck;
		bhitpos.x = mon->mx;
		bhitpos.y = mon->my;
	} else if (dz) {
	    if (dz < 0 && Role_if (PM_VALKYRIE) &&
		    obj->oartifact == ART_MJOLLNIR && !impaired) {
		pline("%s the %s and returns to your hand!",
		      Tobjnam(obj, "hit"), ceiling(u.ux,u.uy));
		obj = addinv(obj);
		encumber_msg();
		setuwep(obj);
		u.twoweap = twoweap;
	    } else if (dz < 0 && !Is_airlevel(&u.uz) &&
		    !Underwater && !Is_waterlevel(&u.uz)) {
		toss_up(obj, ostack, rn2(5));
	    } else {
		hitfloor(obj, ostack, TRUE);
	    }
	    thrownobj = NULL;
	    return;

	} else if (obj->otyp == BOOMERANG && !Underwater) {
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, 1, TRUE);
		mon = boomhit(dx, dy);
		if (mon == &youmonst) {		/* the thing was caught */
			exercise(A_DEX, TRUE);
			obj = addinv(obj);
			encumber_msg();
			if (wep_mask && !(obj->owornmask & wep_mask)) {
			    setworn(obj, wep_mask);
			    u.twoweap = twoweap;
			}
			thrownobj = NULL;
			return;
		}
	} else {
		boolean obj_destroyed;
		urange = (int)(ACURRSTR)/2;
		/* balls are easy to throw or at least roll */
		/* also, this insures the maximum range of a ball is greater
		 * than 1, so the effects from throwing attached balls are
		 * actually possible
		 */
		if (obj->otyp == HEAVY_IRON_BALL)
			range = urange - (int)(obj->owt/100);
		else
			range = urange - (int)(obj->owt/40);
		if (obj == uball) {
			if (u.ustuck) range = 1;
			else if (range >= 5) range = 5;
		}
		if (range < 1) range = 1;

		if (is_ammo(obj)) {
		    if (ammo_and_launcher(obj, uwep))
			range++;
		    else if (obj->oclass != GEM_CLASS)
			range /= 2;
		}

		if (Is_airlevel(&u.uz) || Levitation) {
		    /* action, reaction... */
		    urange -= range;
		    if (urange < 1) urange = 1;
		    range -= urange;
		    if (range < 1) range = 1;
		}

		if (obj->otyp == BOULDER)
		    range = 20;		/* you must be giant */
		else if (obj->oartifact == ART_MJOLLNIR)
		    range = (range + 1) / 2;	/* it's heavy */
		else if (obj == uball && u.utrap && u.utraptype == TT_INFLOOR)
		    range = 1;

		if (Underwater) range = 1;
		
		obj_destroyed = FALSE;
		mon = beam_hit(dx, dy, range, THROWN_WEAPON, NULL, NULL, obj,
			       &obj_destroyed);

		/* have to do this after bhit() so u.ux & u.uy are correct */
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, urange, TRUE);
		
		if (obj_destroyed) return;
	}

	if (mon) {
		boolean obj_gone;

		if (mon->isshk &&
		    obj->where == OBJ_MINVENT && obj->ocarry == mon) {
		    thrownobj = NULL;
		    return;		/* alert shk caught it */
		}
		snuff_candle(obj);
		notonhead = (bhitpos.x != mon->mx || bhitpos.y != mon->my);
		obj_gone = thitmonst(mon, obj, ostack);
		/* Monster may have been tamed; this frees old mon */
		mon = m_at(level, bhitpos.x, bhitpos.y);

		/* [perhaps this should be moved into thitmonst or hmon] */
		if (mon && mon->isshk &&
			(!inside_shop(level, u.ux, u.uy) ||
			 !strchr(in_rooms(level, mon->mx, mon->my, SHOPBASE), *u.ushops)))
		    hot_pursuit(mon);

		if (obj_gone) return;
	}

	if (u.uswallow) {
		/* ball is not picked up by monster */
		if (obj != uball) mpickobj(u.ustuck,obj);
	} else {
		/* the code following might become part of dropy() */
		if (obj->oartifact == ART_MJOLLNIR &&
			Role_if (PM_VALKYRIE) && rn2(100)) {
		    /* we must be wearing Gauntlets of Power to get here */
		    sho_obj_return_to_u(obj, dx, dy);	    /* display its flight */

		    if (!impaired && rn2(100)) {
			pline("%s to your hand!", Tobjnam(obj, "return"));
			obj = addinv(obj);
			encumber_msg();
			setuwep(obj);
			u.twoweap = twoweap;
			if (cansee(bhitpos.x, bhitpos.y))
			    newsym(bhitpos.x,bhitpos.y);
		    } else {
			int dmg = rn2(2);
			if (!dmg) {
			    pline(Blind ? "%s lands %s your %s." :
					"%s back to you, landing %s your %s.",
				  Blind ? "Something" : Tobjnam(obj, "return"),
				  Levitation ? "beneath" : "at",
				  makeplural(body_part(FOOT)));
			} else {
			    dmg += rnd(3);
			    pline(Blind ? "%s your %s!" :
					"%s back toward you, hitting your %s!",
				  Tobjnam(obj, Blind ? "hit" : "fly"),
				  body_part(ARM));
			    artifact_hit(NULL, &youmonst, obj, ostack, TRUE,
					 &dmg, 0);
			    losehp(dmg, xname(obj),
				obj_is_pname(obj) ? KILLED_BY : KILLED_BY_AN);
			}
			if (ship_object(obj, u.ux, u.uy, FALSE)) {
		    	    thrownobj = NULL;
			    return;
			}
			dropy(obj);
		    }
		    thrownobj = NULL;
		    return;
		}

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ) &&
			breaktest(obj)) {
		    tmp_at(DISP_OBJECT, dbuf_objid(obj));
		    tmp_at(bhitpos.x, bhitpos.y);
		    win_delay_output();
		    tmp_at(DISP_END, 0);
		    breakmsg(obj, cansee(bhitpos.x, bhitpos.y));
		    breakobj(obj, bhitpos.x, bhitpos.y, TRUE, TRUE);
		    return;
		}
		if (flooreffects(obj,bhitpos.x,bhitpos.y,"fall")) return;
		obj_no_longer_held(obj);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return;
		if (mon && mon->isshk && is_pick(obj)) {
		    if (cansee(bhitpos.x, bhitpos.y))
			pline("%s snatches up %s.",
			      Monnam(mon), the(xname(obj)));
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);
		    mpickobj(mon, obj);	/* may merge and free obj */
		    thrownobj = NULL;
		    return;
		}
		snuff_candle(obj);
		if (!mon && ship_object(obj, bhitpos.x, bhitpos.y, FALSE)) {
		    thrownobj = NULL;
		    return;
		}
		thrownobj = NULL;
		place_object(obj, level, bhitpos.x, bhitpos.y);
		if (*u.ushops && obj != uball)
		    check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);

		stackobj(obj);
		if (obj == uball)
		    drop_ball(bhitpos.x, bhitpos.y, dx, dy);
		if (cansee(bhitpos.x, bhitpos.y))
		    newsym(bhitpos.x,bhitpos.y);
		if (obj_sheds_light(obj))
		    vision_full_recalc = 1;

		/* Lead autoexplore back over thrown object if it's seen again.
		 * Technically the player may not see where it lands, but they
		 * could probably guess it anyway. */
		level->locations[bhitpos.x][bhitpos.y].mem_stepped = 0;

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ))
		    container_impact_dmg(obj);
	}
}